

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_GetGammas(void *arkode_mem,realtype *gamma,realtype *gamrat,int **jcur,int *dgamma_fail)

{
  long *in_RCX;
  double *in_RDX;
  undefined8 *in_RSI;
  uint *in_R8;
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (ARKodeMRIStepMem *)0xeb64d8);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)(in_stack_ffffffffffffffc0 + 0xa8);
    *in_RDX = *(double *)(in_stack_ffffffffffffffc0 + 0xb8);
    *in_RCX = (long)(in_stack_ffffffffffffffc0 + 0x118);
    *in_R8 = (uint)(*(double *)(in_stack_ffffffffffffffc0 + 0xc0) <= ABS(*in_RDX - 1.0));
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_GetGammas(void* arkode_mem, realtype *gamma,
                      realtype *gamrat, booleantype **jcur,
                      booleantype *dgamma_fail)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_GetGammas",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* set outputs */
  *gamma  = step_mem->gamma;
  *gamrat = step_mem->gamrat;
  *jcur = &step_mem->jcur;
  *dgamma_fail = (SUNRabs(*gamrat - ONE) >= step_mem->dgmax);

  return(ARK_SUCCESS);
}